

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unnest.cpp
# Opt level: O3

OperatorResultType
duckdb::UnnestFunction
          (ExecutionContext *context,TableFunctionInput *data_p,DataChunk *input,DataChunk *output)

{
  GlobalTableFunctionState *pGVar1;
  OperatorResultType OVar2;
  type state_p;
  
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid(&data_p->global_state);
  pGVar1 = (data_p->global_state).ptr;
  optional_ptr<duckdb::LocalTableFunctionState,_true>::CheckValid(&data_p->local_state);
  state_p = unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>::
            operator*((unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>
                       *)((data_p->local_state).ptr + 1));
  OVar2 = PhysicalUnnest::ExecuteInternal
                    (context,input,output,state_p,
                     (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                      *)(pGVar1 + 1),false);
  return OVar2;
}

Assistant:

static OperatorResultType UnnestFunction(ExecutionContext &context, TableFunctionInput &data_p, DataChunk &input,
                                         DataChunk &output) {
	auto &state = data_p.global_state->Cast<UnnestGlobalState>();
	auto &lstate = data_p.local_state->Cast<UnnestLocalState>();
	return PhysicalUnnest::ExecuteInternal(context, input, output, *lstate.operator_state, state.select_list, false);
}